

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.h
# Opt level: O0

char * __thiscall
Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
          (Recycler *this,size_t size)

{
  char *pcVar1;
  size_t size_local;
  Recycler *this_local;
  
  pcVar1 = AllocZeroWithAttributesInlined<(Memory::ObjectInfoBits)256,false>(this,size);
  return pcVar1;
}

Assistant:

char* AllocZeroWithAttributes(DECLSPEC_GUARD_OVERFLOW size_t size)
    {
        return AllocZeroWithAttributesInlined<attributes, nothrow>(size);
    }